

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

UBool __thiscall
icu_63::NumeratorSubstitution::doParse
          (NumeratorSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double upperBound,UBool param_5,uint32_t nonNumericalExecutedRuleMask,
          Formattable *result)

{
  ushort uVar1;
  undefined4 uVar2;
  int32_t iVar3;
  ushort uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  double baseValue_00;
  ParsePosition workPos;
  UErrorCode status;
  UnicodeString workText;
  Formattable temp;
  ParsePosition local_118;
  UErrorCode local_104;
  UnicodeString local_100;
  UnicodeString *local_c0;
  Formattable *local_b8;
  double local_b0;
  double local_a8;
  Formattable local_a0;
  
  local_104 = U_ZERO_ERROR;
  local_b0 = baseValue;
  local_a8 = upperBound;
  UnicodeString::UnicodeString(&local_100,text);
  if (this->withZeros == '\0') {
    iVar7 = 0;
  }
  else {
    local_118.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003ecfe0;
    local_118.index = 1;
    local_118.errorIndex = -1;
    Formattable::Formattable(&local_a0);
    uVar2 = local_100.fUnion.fFields.fLength;
    if (-1 < local_100.fUnion.fStackFields.fLengthAndFlags) {
      uVar2 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    iVar7 = 0;
    local_c0 = text;
    local_b8 = result;
    if ((0 < (int)uVar2) && (iVar7 = 0, local_118.index != 0)) {
      iVar7 = 0;
      while( true ) {
        local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
        NFRuleSet::parse((this->super_NFSubstitution).ruleSet,&local_100,&local_118,1.0,
                         nonNumericalExecutedRuleMask,&local_a0);
        if (local_118.index == 0) break;
        parsePosition->index = parsePosition->index + local_118.index;
        if (local_118.index == 0x7fffffff) {
          uVar1 = local_100.fUnion.fStackFields.fLengthAndFlags & 1;
          local_100.fUnion.fStackFields.fLengthAndFlags =
               local_100.fUnion.fStackFields.fLengthAndFlags & 0x1e;
          if (uVar1 != 0) {
            local_100.fUnion.fStackFields.fLengthAndFlags = 2;
          }
        }
        else {
          UnicodeString::doReplace(&local_100,0,local_118.index,(UChar *)0x0,0,0);
        }
        while( true ) {
          uVar2 = local_100.fUnion.fFields.fLength;
          if (-1 < local_100.fUnion.fStackFields.fLengthAndFlags) {
            uVar2 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if ((int)uVar2 < 1) break;
          uVar5 = local_100.fUnion.fStackFields.fBuffer;
          if (((int)local_100.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
            uVar5 = local_100.fUnion.fFields.fArray;
          }
          if (*(char16_t *)uVar5 != L' ') break;
          UnicodeString::doReplace(&local_100,0,1,(UChar *)0x0,0,0);
          parsePosition->index = parsePosition->index + 1;
        }
        uVar2 = local_100.fUnion.fFields.fLength;
        if (-1 < local_100.fUnion.fStackFields.fLengthAndFlags) {
          uVar2 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar7 = iVar7 + 1;
        if (((int)uVar2 < 1) || (local_118.index == 0)) break;
      }
    }
    UnicodeString::operator=(&local_100,local_c0);
    result = local_b8;
    if (parsePosition->index == 0x7fffffff) {
      uVar4 = local_100.fUnion.fStackFields.fLengthAndFlags & 0x1e;
      uVar1 = local_100.fUnion.fStackFields.fLengthAndFlags & 1;
      local_100.fUnion.fStackFields.fLengthAndFlags = 2;
      if (uVar1 == 0) {
        local_100.fUnion.fStackFields.fLengthAndFlags = uVar4;
      }
    }
    else {
      UnicodeString::doReplace(&local_100,0,parsePosition->index,(UChar *)0x0,0,0);
    }
    parsePosition->index = 0;
    Formattable::~Formattable(&local_a0);
    ParsePosition::~ParsePosition(&local_118);
  }
  baseValue_00 = local_b0;
  if (this->withZeros != '\0') {
    baseValue_00 = 1.0;
  }
  NFSubstitution::doParse
            (&this->super_NFSubstitution,&local_100,parsePosition,baseValue_00,local_a8,'\0',
             nonNumericalExecutedRuleMask,result);
  if (this->withZeros != '\0') {
    iVar3 = Formattable::getLong(result,&local_104);
    if (iVar3 < 1) {
      lVar6 = 1;
    }
    else {
      lVar6 = 1;
      do {
        lVar6 = lVar6 * 10;
      } while (lVar6 <= iVar3);
    }
    if (0 < iVar7) {
      iVar7 = iVar7 + 1;
      do {
        lVar6 = lVar6 * 10;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
    }
    Formattable::setDouble(result,(double)iVar3 / (double)lVar6);
  }
  UnicodeString::~UnicodeString(&local_100);
  return '\x01';
}

Assistant:

UBool 
NumeratorSubstitution::doParse(const UnicodeString& text, 
                               ParsePosition& parsePosition,
                               double baseValue,
                               double upperBound,
                               UBool /*lenientParse*/,
                               uint32_t nonNumericalExecutedRuleMask,
                               Formattable& result) const
{
    // we don't have to do anything special to do the parsing here,
    // but we have to turn lenient parsing off-- if we leave it on,
    // it SERIOUSLY messes up the algorithm

    // if withZeros is true, we need to count the zeros
    // and use that to adjust the parse result
    UErrorCode status = U_ZERO_ERROR;
    int32_t zeroCount = 0;
    UnicodeString workText(text);

    if (withZeros) {
        ParsePosition workPos(1);
        Formattable temp;

        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            getRuleSet()->parse(workText, workPos, 1, nonNumericalExecutedRuleMask, temp); // parse zero or nothing at all
            if (workPos.getIndex() == 0) {
                // we failed, either there were no more zeros, or the number was formatted with digits
                // either way, we're done
                break;
            }

            ++zeroCount;
            parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
            workText.remove(0, workPos.getIndex());
            while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                workText.remove(0, 1);
                parsePosition.setIndex(parsePosition.getIndex() + 1);
            }
        }

        workText = text;
        workText.remove(0, (int32_t)parsePosition.getIndex());
        parsePosition.setIndex(0);
    }

    // we've parsed off the zeros, now let's parse the rest from our current position
    NFSubstitution::doParse(workText, parsePosition, withZeros ? 1 : baseValue, upperBound, FALSE, nonNumericalExecutedRuleMask, result);

    if (withZeros) {
        // any base value will do in this case.  is there a way to
        // force this to not bother trying all the base values?

        // compute the 'effective' base and prescale the value down
        int64_t n = result.getLong(status); // force conversion!
        int64_t d = 1;
        int32_t pow = 0;
        while (d <= n) {
            d *= 10;
            ++pow;
        }
        // now add the zeros
        while (zeroCount > 0) {
            d *= 10;
            --zeroCount;
        }
        // d is now our true denominator
        result.setDouble((double)n/(double)d);
    }

    return TRUE;
}